

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512vnni.cpp
# Opt level: O3

void ncnn::transpose_pack_B_tile_int8_avx512vnni(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void *pvVar1;
  undefined1 (*pauVar2) [64];
  long lVar3;
  long lVar4;
  undefined1 (*pauVar5) [16];
  long lVar6;
  ulong *puVar7;
  undefined1 *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 in_ZMM4 [64];
  long local_98;
  long local_58;
  long local_50;
  
  pauVar2 = (undefined1 (*) [64])BT->data;
  iVar20 = B->w;
  lVar13 = (long)iVar20;
  uVar27 = 0;
  lVar14 = (long)k;
  lVar24 = (long)j;
  if (0xf < max_jj) {
    lVar19 = (long)(iVar20 * 4);
    lVar21 = iVar20 * 3 + lVar24;
    lVar3 = iVar20 * 2 + lVar24;
    lVar12 = lVar13 + lVar24;
    auVar29 = vpbroadcastb_avx512bw(ZEXT116(0x7f));
    uVar16 = 0;
    lVar25 = lVar24;
    do {
      pvVar1 = B->data;
      lVar15 = B->w * lVar14 * B->elemsize;
      if (max_kk < 4) {
        lVar11 = (long)pvVar1 + lVar24 + uVar16;
        uVar26 = 0;
      }
      else {
        lVar11 = (long)pvVar1 + lVar25;
        lVar22 = lVar21 + (long)pvVar1;
        lVar10 = (long)pvVar1 + lVar3;
        lVar4 = (long)pvVar1 + lVar12;
        iVar17 = 3;
        do {
          auVar36 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar11 + lVar15),
                                   *(undefined1 (*) [16])(lVar4 + lVar15));
          auVar32 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar11 + lVar15),
                                   *(undefined1 (*) [16])(lVar4 + lVar15));
          auVar39 = vpunpcklbw_avx(*(undefined1 (*) [16])(lVar10 + lVar15),
                                   *(undefined1 (*) [16])(lVar22 + lVar15));
          auVar28 = vpunpckhbw_avx(*(undefined1 (*) [16])(lVar10 + lVar15),
                                   *(undefined1 (*) [16])(lVar22 + lVar15));
          auVar33 = vpunpcklwd_avx(auVar36,auVar39);
          in_ZMM4 = ZEXT1664(auVar33);
          auVar36 = vpunpckhwd_avx(auVar36,auVar39);
          auVar39 = vpunpcklwd_avx(auVar32,auVar28);
          auVar32 = vpunpckhwd_avx(auVar32,auVar28);
          auVar34._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar39;
          auVar34._16_16_ = ZEXT116(1) * auVar32;
          auVar30 = vinserti64x4_avx512f
                              (ZEXT3264(CONCAT1616(ZEXT116(1) * auVar36,
                                                   ZEXT116(0) * auVar36 + ZEXT116(1) * auVar33)),
                               auVar34,1);
          auVar30 = vpaddb_avx512bw(auVar30,auVar29);
          auVar30 = vmovdqu64_avx512f(auVar30);
          *pauVar2 = auVar30;
          pauVar2 = pauVar2 + 1;
          lVar11 = lVar11 + lVar19;
          lVar22 = lVar22 + lVar19;
          lVar10 = lVar10 + lVar19;
          lVar4 = lVar4 + lVar19;
          iVar17 = iVar17 + 4;
          uVar26 = max_kk & 0xfffffffc;
        } while (iVar17 < max_kk);
      }
      pauVar5 = (undefined1 (*) [16])(lVar11 + lVar15);
      uVar18 = uVar26 | 1;
      while ((int)uVar18 < max_kk) {
        auVar28 = vpunpcklbw_avx(*pauVar5,*(undefined1 (*) [16])(*pauVar5 + lVar13));
        auVar32 = vpunpckhbw_avx(*pauVar5,*(undefined1 (*) [16])(*pauVar5 + lVar13));
        *(undefined1 (*) [16])*pauVar2 = auVar28;
        *(undefined1 (*) [16])(*pauVar2 + 0x10) = auVar32;
        pauVar2 = (undefined1 (*) [64])(*pauVar2 + 0x20);
        pauVar5 = (undefined1 (*) [16])(*pauVar5 + iVar20 * 2);
        uVar18 = uVar26 + 3;
        uVar26 = uVar26 + 2;
      }
      iVar17 = max_kk - uVar26;
      if (iVar17 != 0 && (int)uVar26 <= max_kk) {
        do {
          *(undefined1 (*) [16])*pauVar2 = *pauVar5;
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 0x10);
          pauVar5 = (undefined1 (*) [16])(*pauVar5 + lVar13);
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar27 = uVar16 + 0x10;
      uVar23 = uVar16 + 0x1f;
      lVar25 = lVar25 + 0x10;
      lVar21 = lVar21 + 0x10;
      lVar3 = lVar3 + 0x10;
      lVar12 = lVar12 + 0x10;
      uVar16 = uVar27;
    } while (uVar23 < (uint)max_jj);
  }
  lVar3 = (long)max_jj;
  if ((int)((uint)uVar27 | 7) < max_jj) {
    lVar21 = (long)(iVar20 * 4);
    lVar12 = (uVar27 & 0xffffffff) + lVar24;
    lVar15 = iVar20 * 3 + lVar12;
    lVar25 = lVar12 + iVar20 * 2;
    lVar19 = lVar12 + lVar13;
    auVar31[8] = 0x7f;
    auVar31._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar31[9] = 0x7f;
    auVar31[10] = 0x7f;
    auVar31[0xb] = 0x7f;
    auVar31[0xc] = 0x7f;
    auVar31[0xd] = 0x7f;
    auVar31[0xe] = 0x7f;
    auVar31[0xf] = 0x7f;
    auVar31[0x10] = 0x7f;
    auVar31[0x11] = 0x7f;
    auVar31[0x12] = 0x7f;
    auVar31[0x13] = 0x7f;
    auVar31[0x14] = 0x7f;
    auVar31[0x15] = 0x7f;
    auVar31[0x16] = 0x7f;
    auVar31[0x17] = 0x7f;
    auVar31[0x18] = 0x7f;
    auVar31[0x19] = 0x7f;
    auVar31[0x1a] = 0x7f;
    auVar31[0x1b] = 0x7f;
    auVar31[0x1c] = 0x7f;
    auVar31[0x1d] = 0x7f;
    auVar31[0x1e] = 0x7f;
    auVar31[0x1f] = 0x7f;
    uVar16 = uVar27 & 0xffffffff;
    do {
      pvVar1 = B->data;
      lVar11 = B->w * lVar14 * B->elemsize;
      if (max_kk < 4) {
        lVar10 = (long)pvVar1 + lVar24 + uVar16;
        uVar26 = 0;
      }
      else {
        lVar10 = (long)pvVar1 + lVar12;
        lVar4 = (long)pvVar1 + lVar15;
        lVar22 = (long)pvVar1 + lVar25;
        lVar6 = (long)pvVar1 + lVar19;
        iVar17 = 3;
        do {
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(lVar10 + lVar11);
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(lVar6 + lVar11);
          auVar32 = vpunpcklbw_avx(auVar32,auVar28);
          auVar36._8_8_ = 0;
          auVar36._0_8_ = *(ulong *)(lVar22 + lVar11);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(lVar4 + lVar11);
          auVar28 = vpunpcklbw_avx(auVar36,auVar39);
          auVar36 = vpunpcklwd_avx(auVar32,auVar28);
          auVar32 = vpunpckhwd_avx(auVar32,auVar28);
          auVar35._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar36;
          auVar35._16_16_ = ZEXT116(1) * auVar32;
          auVar34 = vpaddb_avx2(auVar35,auVar31);
          *(undefined1 (*) [32])*pauVar2 = auVar34;
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 0x20);
          lVar10 = lVar10 + lVar21;
          lVar4 = lVar4 + lVar21;
          lVar22 = lVar22 + lVar21;
          lVar6 = lVar6 + lVar21;
          iVar17 = iVar17 + 4;
          uVar26 = max_kk & 0xfffffffc;
        } while (iVar17 < max_kk);
      }
      puVar7 = (ulong *)(lVar10 + lVar11);
      uVar18 = uVar26 | 1;
      while ((int)uVar18 < max_kk) {
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *puVar7;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)((long)puVar7 + lVar13);
        auVar32 = vpunpcklbw_avx(auVar33,auVar37);
        *(undefined1 (*) [16])*pauVar2 = auVar32;
        pauVar2 = (undefined1 (*) [64])(*pauVar2 + 0x10);
        puVar7 = (ulong *)((long)puVar7 + (long)(iVar20 * 2));
        uVar18 = uVar26 + 3;
        uVar26 = uVar26 + 2;
      }
      iVar17 = max_kk - uVar26;
      if (iVar17 != 0 && (int)uVar26 <= max_kk) {
        do {
          *(ulong *)*pauVar2 = *puVar7;
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 8);
          puVar7 = (ulong *)((long)puVar7 + lVar13);
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar27 = uVar16 + 8;
      lVar11 = uVar16 + 0xf;
      lVar12 = lVar12 + 8;
      lVar15 = lVar15 + 8;
      lVar25 = lVar25 + 8;
      lVar19 = lVar19 + 8;
      uVar16 = uVar27;
    } while (lVar11 < lVar3);
  }
  auVar32 = _DAT_005a1bf0;
  if ((int)((uint)uVar27 | 3) < max_jj) {
    auVar28 = vpbroadcastd_avx512vl();
    vpmulld_avx(auVar28,_DAT_005a1650);
    auVar38[8] = 0x7f;
    auVar38._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar38[9] = 0x7f;
    auVar38[10] = 0x7f;
    auVar38[0xb] = 0x7f;
    auVar38[0xc] = 0x7f;
    auVar38[0xd] = 0x7f;
    auVar38[0xe] = 0x7f;
    auVar38[0xf] = 0x7f;
    uVar16 = uVar27 & 0xffffffff;
    do {
      puVar8 = (undefined1 *)((long)B->data + lVar24 + uVar16 + B->w * lVar14 * B->elemsize);
      uVar26 = 0;
      if (3 < max_kk) {
        iVar17 = 3;
        do {
          auVar28 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
          auVar28 = vpgatherdd((undefined1  [16])0x0,auVar28);
          in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
          auVar28 = vpshufb_avx(auVar28,auVar32);
          auVar28 = vpaddb_avx(auVar28,auVar38);
          *(undefined1 (*) [16])*pauVar2 = auVar28;
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 0x10);
          puVar8 = puVar8 + lVar13 * 4;
          iVar17 = iVar17 + 4;
          uVar26 = max_kk & 0xfffffffc;
        } while (iVar17 < max_kk);
      }
      uVar18 = uVar26 | 1;
      while ((int)uVar18 < max_kk) {
        (*pauVar2)[0] = *puVar8;
        (*pauVar2)[1] = puVar8[lVar13];
        (*pauVar2)[2] = puVar8[1];
        (*pauVar2)[3] = puVar8[iVar20 + 1];
        (*pauVar2)[4] = puVar8[2];
        (*pauVar2)[5] = puVar8[iVar20 + 2];
        (*pauVar2)[6] = puVar8[3];
        (*pauVar2)[7] = puVar8[iVar20 + 3];
        pauVar2 = (undefined1 (*) [64])(*pauVar2 + 8);
        puVar8 = puVar8 + lVar13 * 2;
        uVar18 = uVar26 + 3;
        uVar26 = uVar26 + 2;
      }
      iVar17 = max_kk - uVar26;
      if (iVar17 != 0 && (int)uVar26 <= max_kk) {
        puVar8 = puVar8 + 3;
        do {
          (*pauVar2)[0] = puVar8[-3];
          (*pauVar2)[1] = puVar8[-2];
          (*pauVar2)[2] = puVar8[-1];
          (*pauVar2)[3] = *puVar8;
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 4);
          puVar8 = puVar8 + lVar13;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar27 = uVar16 + 4;
      lVar12 = uVar16 + 7;
      uVar16 = uVar27;
    } while (lVar12 < lVar3);
  }
  uVar26 = (uint)uVar27;
  if ((int)(uVar26 | 1) < max_jj) {
    lVar21 = (long)(iVar20 * 4);
    lVar12 = (int)uVar26 + lVar24;
    lVar19 = (iVar20 * 3 + 1) + lVar12;
    local_98 = (iVar20 + 1) + lVar12;
    lVar25 = iVar20 * 3 + lVar12;
    local_50 = iVar20 * 2 + lVar12;
    local_58 = lVar13 + lVar12;
    uVar16 = (long)(int)uVar26;
    do {
      pvVar1 = B->data;
      lVar15 = B->w * lVar14 * B->elemsize;
      if (max_kk < 4) {
        lVar11 = (long)pvVar1 + lVar24 + uVar16;
        uVar26 = 0;
      }
      else {
        lVar11 = (long)pvVar1 + lVar12;
        lVar10 = (long)pvVar1 + lVar19;
        lVar4 = (long)pvVar1 + local_98;
        lVar22 = (long)pvVar1 + lVar25;
        lVar6 = (long)pvVar1 + local_50;
        lVar9 = (long)pvVar1 + local_58;
        iVar17 = 3;
        do {
          (*pauVar2)[0] = *(char *)(lVar11 + lVar15) + '\x7f';
          (*pauVar2)[1] = *(char *)(lVar9 + lVar15) + '\x7f';
          (*pauVar2)[2] = *(char *)(lVar6 + lVar15) + '\x7f';
          (*pauVar2)[3] = *(char *)(lVar22 + lVar15) + '\x7f';
          (*pauVar2)[4] = *(char *)(lVar11 + 1 + lVar15) + '\x7f';
          (*pauVar2)[5] = *(char *)(lVar4 + lVar15) + '\x7f';
          (*pauVar2)[6] = *(char *)(lVar6 + 1 + lVar15) + '\x7f';
          (*pauVar2)[7] = *(char *)(lVar10 + lVar15) + '\x7f';
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 8);
          iVar17 = iVar17 + 4;
          lVar11 = lVar11 + lVar21;
          lVar10 = lVar10 + lVar21;
          lVar4 = lVar4 + lVar21;
          lVar22 = lVar22 + lVar21;
          lVar6 = lVar6 + lVar21;
          lVar9 = lVar9 + lVar21;
          uVar26 = max_kk & 0xfffffffc;
        } while (iVar17 < max_kk);
      }
      puVar8 = (undefined1 *)(lVar11 + lVar15);
      uVar18 = uVar26 | 1;
      while ((int)uVar18 < max_kk) {
        (*pauVar2)[0] = *puVar8;
        (*pauVar2)[1] = puVar8[lVar13];
        (*pauVar2)[2] = puVar8[1];
        (*pauVar2)[3] = puVar8[iVar20 + 1];
        pauVar2 = (undefined1 (*) [64])(*pauVar2 + 4);
        puVar8 = puVar8 + iVar20 * 2;
        uVar18 = uVar26 + 3;
        uVar26 = uVar26 + 2;
      }
      iVar17 = max_kk - uVar26;
      if (iVar17 != 0 && (int)uVar26 <= max_kk) {
        puVar8 = puVar8 + 1;
        do {
          (*pauVar2)[0] = puVar8[-1];
          (*pauVar2)[1] = *puVar8;
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 2);
          puVar8 = puVar8 + lVar13;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar27 = uVar16 + 2;
      lVar15 = uVar16 + 3;
      lVar12 = lVar12 + 2;
      lVar19 = lVar19 + 2;
      local_98 = local_98 + 2;
      lVar25 = lVar25 + 2;
      local_50 = local_50 + 2;
      local_58 = local_58 + 2;
      uVar16 = uVar27;
    } while (lVar15 < lVar3);
  }
  if ((int)uVar27 < max_jj) {
    lVar11 = (long)(iVar20 * 4);
    lVar19 = (long)(int)uVar27;
    lVar12 = lVar19 + lVar24;
    lVar15 = iVar20 * 3 + lVar12;
    lVar21 = iVar20 * 2 + lVar12;
    lVar25 = lVar12 + lVar13;
    do {
      pvVar1 = B->data;
      lVar10 = B->w * lVar14 * B->elemsize;
      if (max_kk < 4) {
        lVar4 = (long)pvVar1 + lVar24 + lVar19;
        uVar26 = 0;
      }
      else {
        lVar4 = (long)pvVar1 + lVar12;
        lVar22 = (long)pvVar1 + lVar15;
        lVar6 = lVar21 + (long)pvVar1;
        lVar9 = (long)pvVar1 + lVar25;
        iVar20 = 3;
        do {
          (*pauVar2)[0] = *(char *)(lVar4 + lVar10) + '\x7f';
          (*pauVar2)[1] = *(char *)(lVar9 + lVar10) + '\x7f';
          (*pauVar2)[2] = *(char *)(lVar6 + lVar10) + '\x7f';
          (*pauVar2)[3] = *(char *)(lVar22 + lVar10) + '\x7f';
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 4);
          iVar20 = iVar20 + 4;
          lVar4 = lVar4 + lVar11;
          lVar22 = lVar22 + lVar11;
          lVar6 = lVar6 + lVar11;
          lVar9 = lVar9 + lVar11;
          uVar26 = max_kk & 0xfffffffc;
        } while (iVar20 < max_kk);
      }
      puVar8 = (undefined1 *)(lVar4 + lVar10);
      iVar20 = max_kk - uVar26;
      if (iVar20 != 0 && (int)uVar26 <= max_kk) {
        do {
          (*pauVar2)[0] = *puVar8;
          pauVar2 = (undefined1 (*) [64])(*pauVar2 + 1);
          puVar8 = puVar8 + lVar13;
          iVar20 = iVar20 + -1;
        } while (iVar20 != 0);
      }
      lVar19 = lVar19 + 1;
      lVar12 = lVar12 + 1;
      lVar15 = lVar15 + 1;
      lVar21 = lVar21 + 1;
      lVar25 = lVar25 + 1;
    } while (lVar19 != lVar3);
  }
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avx512vnni(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}